

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int read_mdef(char *moddeffn,model_def_t **out_mdef,uint32 *out_gau_begin,int32 *cb2mllr)

{
  int32 iVar1;
  uint local_2c;
  int32 *piStack_28;
  uint32 i;
  int32 *cb2mllr_local;
  uint32 *out_gau_begin_local;
  model_def_t **out_mdef_local;
  char *moddeffn_local;
  
  if (moddeffn == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x78,"-moddeffn is not given.\n");
    exit(1);
  }
  iVar1 = model_def_read(out_mdef,moddeffn);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x7b,"Can not read model definition file %s\n",moddeffn);
    exit(1);
  }
  piStack_28 = cb2mllr;
  if (cb2mllr == (int32 *)0x0) {
    piStack_28 = (int32 *)__ckd_calloc__((ulong)(*out_mdef)->n_total_state,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                                         ,0x7f);
  }
  *out_gau_begin = (*out_mdef)->n_tied_ci_state;
  for (local_2c = 0; local_2c < *out_gau_begin; local_2c = local_2c + 1) {
    piStack_28[local_2c] = -1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,0x85,"Use CD senones only. (index >= %d)\n",(ulong)(*out_mdef)->n_tied_ci_state);
  return 0;
}

Assistant:

static int
read_mdef(const char *moddeffn,
	  model_def_t **out_mdef,
	  uint32 *out_gau_begin,
	  int32 *cb2mllr)
{
    uint32 i;

    if (! moddeffn) {
	E_FATAL("-moddeffn is not given.\n");
    }
    else if (model_def_read(out_mdef, moddeffn) != S3_SUCCESS) {
	E_FATAL("Can not read model definition file %s\n", moddeffn);
    }

    if (cb2mllr == NULL)
	cb2mllr = (int32 *)ckd_calloc((*out_mdef)->n_total_state,sizeof(char));
	
    *out_gau_begin = (*out_mdef)->n_tied_ci_state;
    for (i = 0; i < *out_gau_begin; i++) {
	cb2mllr[i] = -1;                    /* skip CI senones */
    }
    E_INFO("Use CD senones only. (index >= %d)\n",(*out_mdef)->n_tied_ci_state);

    return S3_SUCCESS;
}